

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_29d038f::LowBDConvolveScaleTest::RunOne(LowBDConvolveScaleTest *this,bool ref)

{
  ConvolveParams *conv_params;
  int src_stride;
  int dst_stride;
  TestImage<unsigned_char> *pTVar1;
  long lVar2;
  long lVar3;
  uint8_t *dst;
  long lVar4;
  undefined7 in_register_00000031;
  uint8_t *src;
  long lVar5;
  
  pTVar1 = (this->super_ConvolveScaleTestBase<unsigned_char>).image_;
  if ((int)CONCAT71(in_register_00000031,ref) == 0) {
    lVar3 = (long)pTVar1->src_stride_ * ((long)pTVar1->h_ + 0x40);
  }
  else {
    lVar3 = 0;
  }
  src_stride = pTVar1->src_stride_;
  if (ref) {
    lVar5 = 0;
  }
  else {
    lVar5 = (long)pTVar1->dst_stride_ * ((long)pTVar1->h_ + 0x40);
  }
  dst_stride = pTVar1->dst_stride_;
  lVar2 = (long)dst_stride;
  if (ref) {
    lVar4 = 0;
  }
  else {
    lVar4 = ((long)pTVar1->h_ + 0x40) * lVar2;
  }
  src = (pTVar1->src_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start + (long)src_stride * 0x20 + lVar3 + 0x20;
  dst = (pTVar1->dst_data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start + lVar2 * 0x20 + lVar5 + 0x20;
  conv_params = &(this->super_ConvolveScaleTestBase<unsigned_char>).convolve_params_;
  (this->super_ConvolveScaleTestBase<unsigned_char>).convolve_params_.dst =
       (pTVar1->dst_16_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
       _M_impl.super__Vector_impl_data._M_start + lVar4 + lVar2 * 0x20 + 0x20;
  if (ref) {
    av1_convolve_2d_scale_c
              (src,src_stride,dst,dst_stride,
               (this->super_ConvolveScaleTestBase<unsigned_char>).width_,
               (this->super_ConvolveScaleTestBase<unsigned_char>).height_,
               (this->super_ConvolveScaleTestBase<unsigned_char>).filter_x_,
               (this->super_ConvolveScaleTestBase<unsigned_char>).filter_y_,
               (this->super_ConvolveScaleTestBase<unsigned_char>).subpel_x_,0x10,
               (this->super_ConvolveScaleTestBase<unsigned_char>).subpel_y_,0x14,conv_params);
  }
  else {
    (*this->tst_fun_)(src,src_stride,dst,dst_stride,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).width_,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).height_,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).filter_x_,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).filter_y_,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).subpel_x_,0x10,
                      (this->super_ConvolveScaleTestBase<unsigned_char>).subpel_y_,0x14,conv_params)
    ;
  }
  return;
}

Assistant:

void RunOne(bool ref) override {
    const uint8_t *src = image_->GetSrcData(ref, false);
    uint8_t *dst = image_->GetDstData(ref, false);
    convolve_params_.dst = image_->GetDst16Data(ref, false);
    const int src_stride = image_->src_stride();
    const int dst_stride = image_->dst_stride();
    if (ref) {
      av1_convolve_2d_scale_c(src, src_stride, dst, dst_stride, width_, height_,
                              filter_x_, filter_y_, subpel_x_, kXStepQn,
                              subpel_y_, kYStepQn, &convolve_params_);
    } else {
      tst_fun_(src, src_stride, dst, dst_stride, width_, height_, filter_x_,
               filter_y_, subpel_x_, kXStepQn, subpel_y_, kYStepQn,
               &convolve_params_);
    }
  }